

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AntennaLocation.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::AntennaLocation::Decode(AntennaLocation *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0x23 < KVar1) {
    (*(this->m_AntennaLocation).super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_AntennaLocation,stream);
    (*(this->m_RelativeAntennaLocation).super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_RelativeAntennaLocation,stream);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void AntennaLocation::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < ANTENNA_LOCATION_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> KDIS_STREAM m_AntennaLocation
           >> KDIS_STREAM m_RelativeAntennaLocation;
}